

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

void LiteScript::StateExecutor::Execute(State *state,Instruction *instr)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  Object *pOVar4;
  Type *this;
  ClassObject *pCVar5;
  reference pp_Var6;
  Instruction *instr_local;
  State *state_local;
  
  sVar2 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size
                    (&state->op_lifo);
  if (sVar2 != 0) {
    pvVar3 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::back
                       (&state->op_lifo);
    pOVar4 = Variable::operator->(pvVar3);
    this = Object::GetType(pOVar4);
    bVar1 = Type::operator==(this,(Type *)_type_class_object);
    if (bVar1) {
      pvVar3 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::back
                         (&state->op_lifo);
      pOVar4 = Variable::operator->(pvVar3);
      pCVar5 = Object::GetData<LiteScript::ClassObject>(pOVar4);
      pCVar5->ScriptState = state;
    }
  }
  pp_Var6 = std::array<void_(*)(LiteScript::State_&,_LiteScript::Instruction_&),_70UL>::operator[]
                      (&ARRAY,(ulong)instr->code);
  (**pp_Var6)(state,instr);
  return;
}

Assistant:

void LiteScript::StateExecutor::Execute(State &state, Instruction &instr) {
    if (state.op_lifo.size() > 0 && state.op_lifo.back()->GetType() == Type::CLASS_OBJECT)
        state.op_lifo.back()->GetData<ClassObject>().ScriptState = &state;
    StateExecutor::ARRAY[instr.code](state, instr);
}